

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputBuffer.cpp
# Opt level: O0

void __thiscall InputBuffer::syncConsume(InputBuffer *this)

{
  long in_RDI;
  CircularQueue<int> *unaff_retaddr;
  
  while (0 < *(int *)(in_RDI + 0x10)) {
    if (*(int *)(in_RDI + 8) < 1) {
      CircularQueue<int>::removeFirst(unaff_retaddr);
    }
    else {
      *(int *)(in_RDI + 0xc) = *(int *)(in_RDI + 0xc) + 1;
    }
    *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + -1;
  }
  return;
}

Assistant:

void InputBuffer::syncConsume() {
	while (numToConsume > 0) {
		if (nMarkers > 0)
		{
			// guess mode -- leave leading characters and bump offset.
			markerOffset++;
		} else {
			// normal mode -- remove first character
			queue.removeFirst();
		}
		numToConsume--;
	}
}